

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.hpp
# Opt level: O1

Path<SimpleState_*> * __thiscall
xmotion::Dijkstra::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Path<SimpleState_*> *__return_storage_ptr__,Dijkstra *this,
          Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal)

{
  pointer *pppSVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  SimpleState **__args;
  iterator __position;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  start_vtx;
  GetNeighbourFunc_t<SimpleState_*,_double> *pGVar6;
  long *plVar7;
  GetNeighbourFunc_t<SimpleState_*,_double> *in_R9;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph_00;
  vertex_iterator *wp;
  pointer pvVar8;
  long *plVar9;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 uStack_30;
  
  for (puVar2 = *(undefined8 **)(this + 0x18); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    lVar3 = puVar2[2];
    *(undefined2 *)(lVar3 + 0x48) = 0;
    *(undefined8 *)(lVar3 + 0x68) = 0;
    *(undefined8 *)(lVar3 + 0x50) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x58) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x60) = 0x7fefffffffffffff;
  }
  pGVar6 = (GetNeighbourFunc_t<SimpleState_*,_double> *)(long)(int)graph;
  uVar4 = *(ulong *)(this + 0x10);
  plVar7 = *(long **)(*(long *)(this + 8) + ((ulong)pGVar6 % uVar4) * 8);
  plVar9 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar5 = (long *)*plVar7, plVar9 = plVar7,
     (GetNeighbourFunc_t<SimpleState_*,_double> *)((long *)*plVar7)[1] != pGVar6)) {
    while (plVar7 = plVar5, plVar5 = (long *)*plVar7, plVar5 != (long *)0x0) {
      in_R9 = (GetNeighbourFunc_t<SimpleState_*,_double> *)plVar5[1];
      plVar9 = (long *)0x0;
      if (((ulong)in_R9 % uVar4 != (ulong)pGVar6 % uVar4) || (plVar9 = plVar7, in_R9 == pGVar6))
      goto LAB_00102049;
    }
    plVar9 = (long *)0x0;
  }
LAB_00102049:
  if (plVar9 == (long *)0x0) {
    graph_00 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0;
  }
  else {
    graph_00 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)*plVar9;
  }
  pGVar6 = (GetNeighbourFunc_t<SimpleState_*,_double> *)(long)start;
  plVar7 = *(long **)(*(long *)(this + 8) + ((ulong)pGVar6 % uVar4) * 8);
  plVar9 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar5 = (long *)*plVar7, plVar9 = plVar7,
     (GetNeighbourFunc_t<SimpleState_*,_double> *)((long *)*plVar7)[1] != pGVar6)) {
    while (plVar7 = plVar5, plVar5 = (long *)*plVar7, plVar5 != (long *)0x0) {
      in_R9 = (GetNeighbourFunc_t<SimpleState_*,_double> *)plVar5[1];
      plVar9 = (long *)0x0;
      if (((ulong)in_R9 % uVar4 != (ulong)pGVar6 % uVar4) || (plVar9 = plVar7, in_R9 == pGVar6))
      goto LAB_001020ab;
    }
    plVar9 = (long *)0x0;
  }
LAB_001020ab:
  if (plVar9 == (long *)0x0) {
    start_vtx._M_cur = (__node_type *)0x0;
  }
  else {
    start_vtx._M_cur = (__node_type *)*plVar9;
  }
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((graph_00 != (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0) &&
     ((VertexMapTypeIterator)start_vtx._M_cur != (__node_type *)0x0)) {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = (code *)0x0;
    uStack_30 = 0;
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              (&local_60,this,graph_00,(vertex_iterator)start_vtx._M_cur,(vertex_iterator)&local_48,
               in_R9);
    pvVar8 = local_60.
             super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
      pvVar8 = local_60.
               super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pvVar8 != local_60.
                     super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
      __args = *(SimpleState ***)
                ((long)&(((pvVar8->super_const_vertex_iterator).super_VertexMapTypeIterator.
                          super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                         ._M_cur)->
                        super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>
                        ._M_storage._M_storage + 8);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<SimpleState*,std::allocator<SimpleState*>>::
        _M_realloc_insert<SimpleState*const&>
                  ((vector<SimpleState*,std::allocator<SimpleState*>> *)__return_storage_ptr__,
                   __position,__args);
      }
      else {
        *__position._M_current = *__args;
        pppSVar1 = &(__return_storage_ptr__->
                    super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    if (local_60.
        super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Path<State> Search(Graph<State, Transition, StateIndexer> *graph,
                            VertexIdentifier start, VertexIdentifier goal) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }